

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O3

JsErrorCode JsNumberToInt(JsValueRef value,int *asInt)

{
  code *pcVar1;
  DebugCheckNoException DVar2;
  bool bVar3;
  Data DVar4;
  uint uVar5;
  undefined8 in_RAX;
  undefined4 *puVar6;
  DebugCheckNoException local_38;
  DebugCheckNoException __debugCheckNoException;
  
  if (value == (JsValueRef)0x0) {
    return JsErrorInvalidArgument;
  }
  if (asInt == (int *)0x0) {
    return JsErrorNullArgument;
  }
  local_38._5_3_ = SUB83((ulong)in_RAX >> 0x28,0);
  local_38.__exceptionCheck.handledExceptionType = (ExceptionType)in_RAX;
  local_38.hasException = true;
  DVar4 = ExceptionCheck::Save();
  DVar2 = local_38;
  local_38.__exceptionCheck.handledExceptionType = DVar4.handledExceptionType;
  if (((ulong)value & 0x1ffff00000000) == 0x1000000000000 ||
      ((ulong)value & 0xffff000000000000) != 0x1000000000000) {
    if (((ulong)value & 0xffff000000000000) != 0x1000000000000) {
      if ((ulong)value >> 0x32 == 0) {
        *asInt = 0;
        local_38._5_3_ = DVar2._5_3_;
        local_38.hasException = false;
        DebugCheckNoException::~DebugCheckNoException(&local_38);
        return JsErrorInvalidArgument;
      }
      uVar5 = Js::JavascriptConversion::ToInt32((double)((ulong)value ^ 0xfffc000000000000));
      value = (JsValueRef)(ulong)uVar5;
      goto LAB_0036c9f2;
    }
  }
  else {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/../Runtime/Language/TaggedInt.inl"
                       ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                       "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar3) goto LAB_0036ca2c;
    *puVar6 = 0;
  }
  if (((ulong)value & 0x1ffff00000000) != 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/../Runtime/Language/TaggedInt.inl"
                       ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                       "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar3) {
LAB_0036ca2c:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar6 = 0;
  }
LAB_0036c9f2:
  *asInt = (int)value;
  local_38.hasException = false;
  DebugCheckNoException::~DebugCheckNoException(&local_38);
  return JsNoError;
}

Assistant:

END_JSRT_NO_EXCEPTION
}

CHAKRA_API JsNumberToInt(_In_ JsValueRef value, _Out_ int *asInt)
{
    VALIDATE_JSREF(value);
    PARAM_NOT_NULL(asInt);

    BEGIN_JSRT_NO_EXCEPTION
    {
        if (Js::TaggedInt::Is(value))
        {
            *asInt = Js::TaggedInt::ToInt32(value);
        }